

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::ReplaceString(string *source,char *replace,char *with)

{
  size_t replaceSize;
  char *__s;
  allocator<char> local_41;
  string local_40;
  
  if (*replace != '\0') {
    replaceSize = strlen(replace);
    __s = "";
    if (with != (char *)0x0) {
      __s = with;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
    SystemToolsStatic::ReplaceString(source,replace,replaceSize,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void SystemTools::ReplaceString(std::string& source, const char* replace,
                                const char* with)
{
  // do while hangs if replaceSize is 0
  if (!*replace) {
    return;
  }

  SystemToolsStatic::ReplaceString(source, replace, strlen(replace),
                                   with ? with : "");
}